

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

int __thiscall QSQLiteDriver::open(QSQLiteDriver *this,char *__file,int __oflag,...)

{
  QStringView *this_00;
  QArrayDataPointer<char16_t> *this_01;
  long lVar1;
  sqlite3 *descr;
  uint uVar2;
  long lVar3;
  char cVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  bool bVar11;
  byte bVar12;
  byte bVar13;
  int iVar14;
  uint uVar15;
  undefined8 uVar16;
  QCache<QString,_QRegularExpression> *this_02;
  char *zVfs;
  long lVar17;
  char *filename;
  long lVar18;
  sqlite3 **ppDb;
  long in_FS_OFFSET;
  QStringView QVar19;
  QLatin1StringView s;
  QLatin1StringView s_00;
  long in_stack_00000008;
  uint local_104;
  int local_100;
  undefined1 local_a8 [24];
  QArrayDataPointer<char16_t> local_90;
  char *local_78;
  bool ok;
  QStringView local_68;
  QArrayDataPointer<QStringView> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  cVar4 = (**(code **)(*(long *)this + 0x60))(this,__file,___oflag);
  if (cVar4 != '\0') {
    (**(code **)(*(long *)this + 0xc0))(this);
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d._0_4_ = -0x55555556;
  local_58.d._4_4_ = -0x55555556;
  local_58.ptr._0_4_ = -0x55555556;
  local_58.ptr._4_4_ = -0x55555556;
  local_90.d._0_4_ = (undefined4)*(undefined8 *)(in_stack_00000008 + 0x10);
  local_90.d._4_4_ = (undefined4)((ulong)*(undefined8 *)(in_stack_00000008 + 0x10) >> 0x20);
  local_90.ptr._0_4_ = (undefined4)*(undefined8 *)(in_stack_00000008 + 8);
  local_90.ptr._4_4_ = (undefined4)((ulong)*(undefined8 *)(in_stack_00000008 + 8) >> 0x20);
  QStringView::split(&local_58,local_a8 + 0x18,0x3b);
  lVar3 = CONCAT44(local_58.ptr._4_4_,(int)local_58.ptr);
  lVar17 = local_58.size << 4;
  local_100 = 5000;
  bVar5 = 1;
  local_104 = 0x19;
  bVar13 = 0;
  bVar12 = 0;
  bVar11 = false;
  bVar7 = false;
  bVar9 = 0;
  bVar8 = 0;
  bVar10 = 0;
  for (lVar18 = 0; lVar17 != lVar18; lVar18 = lVar18 + 0x10) {
    local_68 = *(QStringView *)(lVar3 + lVar18);
    local_68 = QStringView::trimmed(&local_68);
    s.m_data = "QSQLITE_BUSY_TIMEOUT";
    s.m_size = 0x14;
    bVar6 = QStringView::startsWith(&local_68,s,CaseSensitive);
    if (bVar6) {
      QVar19 = QStringView::mid(&local_68,0x14,-1);
      local_90.d._0_4_ = (undefined4)QVar19.m_size;
      local_90.d._4_4_ = QVar19.m_size._4_4_;
      local_90.ptr._0_4_ = QVar19.m_data._0_4_;
      local_90.ptr._4_4_ = QVar19.m_data._4_4_;
      local_68 = QStringView::trimmed((QStringView *)(local_a8 + 0x18));
      if ((local_68.m_size != 0) && (*local_68.m_data == L'=')) {
        ok = true;
        local_a8._0_16_ = (undefined1  [16])QStringView::mid(&local_68,1,-1);
        QVar19 = QStringView::trimmed((QStringView *)local_a8);
        local_90.d._0_4_ = (undefined4)QVar19.m_size;
        local_90.d._4_4_ = QVar19.m_size._4_4_;
        local_90.ptr._0_4_ = QVar19.m_data._0_4_;
        local_90.ptr._4_4_ = QVar19.m_data._4_4_;
        iVar14 = QStringView::toInt((QStringView *)(local_a8 + 0x18),&ok,10);
        if (ok != false) {
          local_100 = iVar14;
        }
      }
    }
    else {
      local_90.d._0_4_ = 0x12;
      local_90.d._4_4_ = 0;
      local_90.ptr._0_4_ = 0x1e126c;
      local_90.ptr._4_4_ = 0;
      this_00 = (QStringView *)(local_a8 + 0x18);
      bVar6 = comparesEqual((QLatin1StringView *)this_00,&local_68);
      if (bVar6) {
        bVar7 = true;
      }
      else {
        local_90.d._0_4_ = 0x15;
        local_90.d._4_4_ = 0;
        local_90.ptr._0_4_ = 0x1e127f;
        local_90.ptr._4_4_ = 0;
        bVar6 = comparesEqual((QLatin1StringView *)this_00,&local_68);
        if (bVar6) {
          bVar8 = 1;
        }
        else {
          local_90.d._0_4_ = 0x10;
          local_90.d._4_4_ = 0;
          local_90.ptr._0_4_ = 0x1e1295;
          local_90.ptr._4_4_ = 0;
          bVar6 = comparesEqual((QLatin1StringView *)this_00,&local_68);
          if (bVar6) {
            bVar9 = 1;
          }
          else {
            local_90.d._0_4_ = 0x1b;
            local_90.d._4_4_ = 0;
            local_90.ptr._0_4_ = 0x1e12a6;
            local_90.ptr._4_4_ = 0;
            bVar6 = comparesEqual((QLatin1StringView *)this_00,&local_68);
            if (bVar6) {
              bVar10 = 1;
            }
            else {
              local_90.d._0_4_ = 0x24;
              local_90.d._4_4_ = 0;
              local_90.ptr._0_4_ = 0x1e12c2;
              local_90.ptr._4_4_ = 0;
              bVar6 = comparesEqual((QLatin1StringView *)this_00,&local_68);
              if (bVar6) {
                bVar5 = 0;
              }
              else {
                local_90.d._0_4_ = 0x25;
                local_90.d._4_4_ = 0;
                local_90.ptr._0_4_ = 0x1e12e7;
                local_90.ptr._4_4_ = 0;
                bVar6 = comparesEqual((QLatin1StringView *)this_00,&local_68);
                if (bVar6) {
                  bVar11 = true;
                }
                else {
                  local_90.d._0_4_ = 0x15;
                  local_90.d._4_4_ = 0;
                  local_90.ptr._0_4_ = 0x1e130d;
                  local_90.ptr._4_4_ = 0;
                  bVar6 = comparesEqual((QLatin1StringView *)this_00,&local_68);
                  if (bVar6) {
                    bVar12 = 1;
                  }
                  else {
                    s_00.m_data = "QSQLITE_ENABLE_REGEXP";
                    s_00.m_size = 0x15;
                    bVar6 = QStringView::startsWith(&local_68,s_00,CaseSensitive);
                    if (bVar6) {
                      QVar19 = QStringView::mid(&local_68,0x15,-1);
                      local_90.d._0_4_ = (undefined4)QVar19.m_size;
                      local_90.d._4_4_ = QVar19.m_size._4_4_;
                      local_90.ptr._0_4_ = QVar19.m_data._0_4_;
                      local_90.ptr._4_4_ = QVar19.m_data._4_4_;
                      local_68 = QStringView::trimmed(this_00);
                      if (local_68.m_size == 0) {
                        bVar13 = 1;
                      }
                      else if (*local_68.m_data == L'=') {
                        ok = false;
                        local_a8._0_16_ = (undefined1  [16])QStringView::mid(&local_68,1,-1);
                        QVar19 = QStringView::trimmed((QStringView *)local_a8);
                        local_90.d._0_4_ = (undefined4)QVar19.m_size;
                        local_90.d._4_4_ = QVar19.m_size._4_4_;
                        local_90.ptr._0_4_ = QVar19.m_data._0_4_;
                        local_90.ptr._4_4_ = QVar19.m_data._4_4_;
                        uVar15 = QStringView::toInt(this_00,&ok,10);
                        uVar2 = local_104;
                        if (ok != false) {
                          uVar2 = uVar15;
                        }
                        if (0 < (int)uVar15) {
                          local_104 = uVar2;
                        }
                        bVar13 = bVar13 | ok;
                      }
                    }
                    else {
                      lcSqlite();
                      if (((byte)lcSqlite::category.field_2.bools.enabledWarning._q_value._M_base.
                                 _M_i & 1) != 0) {
                        local_90.d._0_4_ = 2;
                        local_90.d._4_4_ = 0;
                        local_90.ptr._0_4_ = 0;
                        local_90.ptr._4_4_ = 0;
                        local_90.size._0_4_ = 0;
                        local_90.size._4_4_ = 0;
                        local_78 = lcSqlite::category.name;
                        QStringView::toString((QString *)local_a8,&local_68);
                        uVar16 = QString::utf16();
                        QMessageLogger::warning((char *)this_00,"Unsupported option \'%ls\'",uVar16)
                        ;
                        QArrayDataPointer<char16_t>::~QArrayDataPointer
                                  ((QArrayDataPointer<char16_t> *)local_a8);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  QString::toUtf8_helper((QString *)(local_a8 + 0x18));
  filename = (char *)CONCAT44(local_90.ptr._4_4_,local_90.ptr._0_4_);
  if (filename == (char *)0x0) {
    filename = (char *)&QByteArray::_empty;
  }
  ppDb = (sqlite3 **)(lVar1 + 0xa8);
  zVfs = (char *)0x0;
  if (bVar7) {
    zVfs = "QtVFS";
  }
  iVar14 = sqlite3_open_v2(filename,ppDb,
                           (uint)bVar12 * 0x1000000 +
                           ((uint)bVar9 << 6 | ((byte)~bVar10 & 1) << 0x11 | ((byte)~bVar8 & 1) * 5)
                           + 0x28001,zVfs);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)(local_a8 + 0x18));
  if (iVar14 == 0) {
    sqlite3_busy_timeout(*ppDb,local_100);
    sqlite3_extended_result_codes(*ppDb,(uint)bVar5);
    (**(code **)(*(long *)this + 0x110))(this,1);
    (**(code **)(*(long *)this + 0x118))(this,0);
    if ((bVar13 & 1) != 0) {
      this_02 = (QCache<QString,_QRegularExpression> *)operator_new(0x48);
      QCache<QString,_QRegularExpression>::QCache(this_02,(ulong)local_104);
      sqlite3_create_function_v2
                (*ppDb,"regexp",2,1,this_02,_q_regexp,
                 (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                 (_func_void_sqlite3_context_ptr *)0x0,_q_regexp_cleanup);
    }
    if (bVar11) {
      sqlite3_create_function_v2
                (*ppDb,"lower",1,1,(void *)0x0,_q_lower,
                 (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                 (_func_void_sqlite3_context_ptr *)0x0,(_func_void_void_ptr *)0x0);
      sqlite3_create_function_v2
                (*ppDb,"upper",1,1,(void *)0x0,_q_upper,
                 (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                 (_func_void_sqlite3_context_ptr *)0x0,(_func_void_void_ptr *)0x0);
    }
  }
  else {
    descr = *ppDb;
    this_01 = (QArrayDataPointer<char16_t> *)(local_a8 + 0x18);
    tr((QString *)this_01,"Error opening database",(char *)0x0,-1);
    qMakeError((sqlite3 *)local_a8,(QString *)descr,(ErrorType)this_01,1);
    (**(code **)(*(long *)this + 0x120))(this,(sqlite3 *)local_a8);
    QSqlError::~QSqlError((QSqlError *)local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_01);
    (**(code **)(*(long *)this + 0x118))(this,1);
    if (*ppDb != (sqlite3 *)0x0) {
      sqlite3_close(*ppDb);
      *ppDb = (sqlite3 *)0x0;
    }
  }
  QArrayDataPointer<QStringView>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return CONCAT31((int3)((uint)iVar14 >> 8),iVar14 == 0);
}

Assistant:

bool QSQLiteDriver::open(const QString & db, const QString &, const QString &, const QString &, int, const QString &conOpts)
{
    Q_D(QSQLiteDriver);
    if (isOpen())
        close();


    int timeOut = 5000;
    bool sharedCache = false;
    bool openReadOnlyOption = false;
    bool openUriOption = false;
    bool useExtendedResultCodes = true;
    bool useQtVfs = false;
    bool useQtCaseFolding = false;
    bool openNoFollow = false;
#if QT_CONFIG(regularexpression)
    static const auto regexpConnectOption = "QSQLITE_ENABLE_REGEXP"_L1;
    bool defineRegexp = false;
    int regexpCacheSize = 25;
#endif

    const auto opts = QStringView{conOpts}.split(u';', Qt::SkipEmptyParts);
    for (auto option : opts) {
        option = option.trimmed();
        if (option.startsWith("QSQLITE_BUSY_TIMEOUT"_L1)) {
            option = option.mid(20).trimmed();
            if (option.startsWith(u'=')) {
                bool ok;
                const int nt = option.mid(1).trimmed().toInt(&ok);
                if (ok)
                    timeOut = nt;
            }
        } else if (option == "QSQLITE_USE_QT_VFS"_L1) {
            useQtVfs = true;
        } else if (option == "QSQLITE_OPEN_READONLY"_L1) {
            openReadOnlyOption = true;
        } else if (option == "QSQLITE_OPEN_URI"_L1) {
            openUriOption = true;
        } else if (option == "QSQLITE_ENABLE_SHARED_CACHE"_L1) {
            sharedCache = true;
        } else if (option == "QSQLITE_NO_USE_EXTENDED_RESULT_CODES"_L1) {
            useExtendedResultCodes = false;
        } else if (option == "QSQLITE_ENABLE_NON_ASCII_CASE_FOLDING"_L1) {
            useQtCaseFolding = true;
        } else if (option == "QSQLITE_OPEN_NOFOLLOW"_L1) {
            openNoFollow = true;
        }
#if QT_CONFIG(regularexpression)
        else if (option.startsWith(regexpConnectOption)) {
            option = option.mid(regexpConnectOption.size()).trimmed();
            if (option.isEmpty()) {
                defineRegexp = true;
            } else if (option.startsWith(u'=')) {
                bool ok = false;
                const int cacheSize = option.mid(1).trimmed().toInt(&ok);
                if (ok) {
                    defineRegexp = true;
                    if (cacheSize > 0)
                        regexpCacheSize = cacheSize;
                }
            }
        }
#endif
        else
            qCWarning(lcSqlite, "Unsupported option '%ls'", qUtf16Printable(option.toString()));
    }

    int openMode = (openReadOnlyOption ? SQLITE_OPEN_READONLY : (SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE));
    openMode |= (sharedCache ? SQLITE_OPEN_SHAREDCACHE : SQLITE_OPEN_PRIVATECACHE);
    if (openUriOption)
        openMode |= SQLITE_OPEN_URI;
    if (openNoFollow) {
#if defined(SQLITE_OPEN_NOFOLLOW)
        openMode |= SQLITE_OPEN_NOFOLLOW;
#else
        qCWarning(lcSqlite, "SQLITE_OPEN_NOFOLLOW not supported with the SQLite version %s", sqlite3_libversion());
#endif
    }

    openMode |= SQLITE_OPEN_NOMUTEX;

    const int res = sqlite3_open_v2(db.toUtf8().constData(), &d->access, openMode, useQtVfs ? "QtVFS" : nullptr);

    if (res == SQLITE_OK) {
        sqlite3_busy_timeout(d->access, timeOut);
        sqlite3_extended_result_codes(d->access, useExtendedResultCodes);
        setOpen(true);
        setOpenError(false);
#if QT_CONFIG(regularexpression)
        if (defineRegexp) {
            auto cache = new QCache<QString, QRegularExpression>(regexpCacheSize);
            sqlite3_create_function_v2(d->access, "regexp", 2, SQLITE_UTF8, cache,
                                       &_q_regexp, nullptr,
                                       nullptr, &_q_regexp_cleanup);
        }
#endif
        if (useQtCaseFolding) {
            sqlite3_create_function_v2(d->access, "lower", 1, SQLITE_UTF8, nullptr,
                                       &_q_lower, nullptr, nullptr, nullptr);
            sqlite3_create_function_v2(d->access, "upper", 1, SQLITE_UTF8, nullptr,
                                       &_q_upper, nullptr, nullptr, nullptr);
        }
        return true;
    } else {
        setLastError(qMakeError(d->access, tr("Error opening database"),
                     QSqlError::ConnectionError, res));
        setOpenError(true);

        if (d->access) {
            sqlite3_close(d->access);
            d->access = nullptr;
        }

        return false;
    }
}